

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.h
# Opt level: O1

bool __thiscall mjs::gc_heap::type_check<mjs::global_object_impl>(gc_heap *this,uint32_t pos)

{
  uint uVar1;
  uint uVar2;
  slot *psVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = pos - 1;
  uVar1 = (this->alloc_context_).start_;
  if ((uVar1 <= uVar5) && (uVar2 = (this->alloc_context_).next_free_, uVar5 < uVar2)) {
    psVar3 = (this->alloc_context_).storage_;
    if (gc_type_info::num_types_ <= psVar3[uVar5].allocation.type) {
      __assert_fail("index < num_types_",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h"
                    ,0x44,"static const gc_type_info &mjs::gc_type_info::from_index(uint32_t)");
    }
    if (*(char *)(*(long *)(gc_type_info::types_ + ((ulong)psVar3[uVar5].allocation >> 0x20) * 8) +
                 0x18) == '\x01') {
      if ((pos < uVar1) || (uVar2 <= pos)) goto LAB_001412d7;
      if (psVar3 != (slot *)0x0) {
        lVar4 = __dynamic_cast(psVar3 + pos,&object::typeinfo,&global_object_impl::typeinfo,0);
        return lVar4 != 0;
      }
    }
    return false;
  }
LAB_001412d7:
  __assert_fail("pos_inside(pos)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_heap.h",
                0x13a,"slot *mjs::gc_heap::allocation_context::get_at(uint32_t) const");
}

Assistant:

bool type_check(uint32_t pos) const {
        const auto a = get_at(pos-1)->allocation;
        if constexpr (std::is_convertible_v<T*, object*>) {
            // Avoid creating gc_type_info_registration<T>'s for interface types
            return a.type_info().is_convertible_to_object() && dynamic_cast<T*>(reinterpret_cast<object*>(get_at(pos)));
        } else {
            return gc_type_info_registration<T>::index()  == a.type;
        }
    }